

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O1

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>::
Unarchive(FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
          *this,MemIOReader *Reader)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  iterator __position;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  uint unaff_R13D;
  bool bVar8;
  byte bVar9;
  value_type tmp_item;
  ArchivableUi16 local_48;
  vector<Kumu::ArchivableUi16,std::allocator<Kumu::ArchivableUi16>> *local_38;
  
  uVar4 = (ulong)Reader->m_capacity;
  uVar6 = (ulong)Reader->m_size;
  uVar1 = uVar6 + 4;
  if (uVar1 <= uVar4) {
    uVar5 = *(uint *)(Reader->m_p + uVar6);
    unaff_R13D = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar5 = Reader->m_size + 4;
    uVar6 = (ulong)uVar5;
    Reader->m_size = uVar5;
  }
  bVar9 = (byte)uVar6;
  if (uVar4 < uVar1) {
    bVar7 = false;
  }
  else {
    uVar5 = Reader->m_size;
    uVar1 = (ulong)uVar5 + 4;
    if (uVar1 <= uVar4) {
      iVar2 = *(int *)(Reader->m_p + uVar5);
      Reader->m_size = uVar5 + 4;
      bVar9 = iVar2 == 0x2000000;
    }
    bVar7 = false;
    if ((uVar1 <= uVar4) && (unaff_R13D == 0 || (bVar9 & 1) != 0)) {
      if (unaff_R13D == 0) {
        bVar7 = true;
      }
      else {
        local_38 = (vector<Kumu::ArchivableUi16,std::allocator<Kumu::ArchivableUi16>> *)
                   &this->super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>;
        uVar5 = 1;
        do {
          local_48.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00223dd8;
          local_48.value = 0;
          if (Reader == (MemIOReader *)0x0) {
            bVar7 = false;
          }
          else {
            uVar3 = Reader->m_size;
            uVar1 = (ulong)uVar3 + 2;
            bVar7 = uVar1 <= Reader->m_capacity;
            if (uVar1 <= Reader->m_capacity) {
              local_48.value =
                   *(ushort *)(Reader->m_p + uVar3) << 8 | *(ushort *)(Reader->m_p + uVar3) >> 8;
              Reader->m_size = uVar3 + 2;
              bVar7 = true;
            }
          }
          if (bVar7 != false) {
            __position._M_current =
                 (this->super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>).
                 super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>).
                super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Kumu::ArchivableUi16,std::allocator<Kumu::ArchivableUi16>>::
              _M_realloc_insert<Kumu::ArchivableUi16_const&>(local_38,__position,&local_48);
            }
            else {
              ((__position._M_current)->super_IArchive)._vptr_IArchive =
                   (_func_int **)&PTR__IArchive_00223dd8;
              (__position._M_current)->value = local_48.value;
              (this->super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>).
              super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
              _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          bVar8 = uVar5 < unaff_R13D;
          uVar5 = uVar5 + 1;
        } while ((bVar7 & bVar8) != 0);
      }
    }
  }
  return bVar7;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }